

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O3

void save_object_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  Am_Value *value_00;
  ostream *poVar1;
  Am_Object object;
  Am_Save_Object_Method method;
  Am_Object local_30;
  Am_Save_Object_Method local_28;
  
  Am_Object::Am_Object(&local_30,value);
  value_00 = Am_Object::Get(&local_30,0xb7,0);
  Am_Save_Object_Method::Am_Save_Object_Method(&local_28,value_00);
  if (local_28.Call != (Am_Save_Object_Method_Type *)0x0) {
    (*local_28.Call)(os,context,&local_30);
    Am_Object::~Am_Object(&local_30);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Object ",7);
  poVar1 = operator<<((ostream *)&std::cerr,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," does not have a save method in its Am_SAVE_OBJECT_METHOD slot",0x3e);
  std::endl<char,std::char_traits<char>>(poVar1);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_object,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  Am_Object object = value;
  Am_Save_Object_Method method = object.Get(Am_SAVE_OBJECT_METHOD);
  if (!method.Valid())
    Am_ERRORO(
        "Object "
            << object
            << " does not have a save method in its Am_SAVE_OBJECT_METHOD slot",
        object, Am_SAVE_OBJECT_METHOD);
  method.Call(os, context, object);
}